

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_php.cpp
# Opt level: O2

void __thiscall
flatbuffers::php::PhpGenerator::GenTableBuilders
          (PhpGenerator *this,StructDef *struct_def,string *code_ptr)

{
  BaseType BVar1;
  FieldDef *field;
  size_t offset;
  pointer ppFVar2;
  pointer ppFVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  GetStartOfTable(struct_def,code_ptr);
  ppFVar2 = (struct_def->fields).vec.
            super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  for (ppFVar3 = ppFVar2;
      ppFVar3 !=
      (struct_def->fields).vec.
      super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppFVar3 = ppFVar3 + 1) {
    field = *ppFVar3;
    if (field->deprecated == false) {
      offset = (long)ppFVar2 -
               (long)(struct_def->fields).vec.
                     super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3;
      if ((field->value).type.base_type == BASE_TYPE_UNION) {
        std::operator+(&local_70,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &Indent_abi_cxx11_,"public static function add");
        std::__cxx11::string::append((string *)code_ptr);
        std::__cxx11::string::~string((string *)&local_70);
        ConvertCase(&local_70,(string *)field,kUpperCamel,kSnake);
        std::__cxx11::string::append((string *)code_ptr);
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::append((char *)code_ptr);
        std::operator+(&local_70,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &Indent_abi_cxx11_,"{\n");
        std::__cxx11::string::append((string *)code_ptr);
        std::__cxx11::string::~string((string *)&local_70);
        std::operator+(&local_50,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &Indent_abi_cxx11_,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &Indent_abi_cxx11_);
        std::operator+(&local_70,&local_50,"$builder->addOffsetX(");
        std::__cxx11::string::append((string *)code_ptr);
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::~string((string *)&local_50);
        NumToString<long>(&local_50,offset);
        std::operator+(&local_70,&local_50,", $offset, 0);\n");
        std::__cxx11::string::append((string *)code_ptr);
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::~string((string *)&local_50);
        std::operator+(&local_70,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &Indent_abi_cxx11_,"}\n\n");
        std::__cxx11::string::append((string *)code_ptr);
        std::__cxx11::string::~string((string *)&local_70);
      }
      else {
        BuildFieldOfTable(field,offset,code_ptr);
      }
      BVar1 = (field->value).type.base_type;
      if ((BVar1 == BASE_TYPE_VECTOR64) || (BVar1 == BASE_TYPE_VECTOR)) {
        BuildVectorOfTable(field,code_ptr);
      }
    }
    ppFVar2 = ppFVar2 + 1;
  }
  GetEndOffsetOnTable(this,struct_def,code_ptr);
  return;
}

Assistant:

void GenTableBuilders(const StructDef &struct_def, std::string *code_ptr) {
    GetStartOfTable(struct_def, code_ptr);

    for (auto it = struct_def.fields.vec.begin();
         it != struct_def.fields.vec.end(); ++it) {
      auto &field = **it;
      if (field.deprecated) continue;

      auto offset = it - struct_def.fields.vec.begin();
      if (field.value.type.base_type == BASE_TYPE_UNION) {
        std::string &code = *code_ptr;
        code += Indent + "public static function add";
        code += ConvertCase(field.name, Case::kUpperCamel);
        code += "(FlatBufferBuilder $builder, $offset)\n";
        code += Indent + "{\n";
        code += Indent + Indent + "$builder->addOffsetX(";
        code += NumToString(offset) + ", $offset, 0);\n";
        code += Indent + "}\n\n";
      } else {
        BuildFieldOfTable(field, offset, code_ptr);
      }
      if (IsVector(field.value.type)) { BuildVectorOfTable(field, code_ptr); }
    }

    GetEndOffsetOnTable(struct_def, code_ptr);
  }